

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O1

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLPToState::operator()
          (StoreLPToState *this,iterator_t *str,iterator_t end)

{
  parsed_t pVar1;
  uint uVar2;
  pointer puVar3;
  ulong uVar4;
  E *this_00;
  ostream *poVar5;
  undefined8 *puVar6;
  uint *__args;
  iterator __position;
  ParserPOMDPFormat_Spirit *pPVar7;
  Index local_1b0 [4];
  ostream local_1a0 [376];
  
  pPVar7 = this->_m_po;
  puVar3 = (pPVar7->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pPVar7->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (pPVar7->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  pVar1 = pPVar7->_m_lp_type;
  if (pVar1 == ASTERICK) {
    __position._M_current =
         (pPVar7->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pPVar7->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      __args = &pPVar7->_m_anyStateIndex;
LAB_0043585c:
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar7->_m_lp_toSI,__position
                 ,__args);
      return;
    }
    *__position._M_current = pPVar7->_m_anyStateIndex;
    (pPVar7->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  else {
    if (pVar1 == STRING) {
      local_1b0[0] = MADPComponentDiscreteStates::GetStateIndexByName
                               (&(pPVar7->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                 super_MultiAgentDecisionProcessDiscrete._m_S,&pPVar7->_m_lp_string)
      ;
      pPVar7 = this->_m_po;
      __position._M_current =
           (pPVar7->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pPVar7->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar7->_m_lp_toSI,
                   __position,local_1b0);
        return;
      }
    }
    else {
      if (pVar1 != UINT) {
        this_00 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_00,
             "StoreLPToState expected that the last parsed type is a state index(uint), state name (string) or wilcard (\'*\')."
            );
        __cxa_throw(this_00,&E::typeinfo,E::~E);
      }
      uVar2 = pPVar7->_m_lp_uint;
      uVar4 = (**(code **)(*(long *)&(pPVar7->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                     super_MultiAgentDecisionProcessDiscrete.
                                     super_MultiAgentDecisionProcess + 0x30))();
      if (uVar4 <= uVar2) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"StoreLPToState: \'",0x11);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\' is not a valid state index!? Number of states is ",0x33);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," (at ",5);
        poVar5 = POMDPFormatParsing::operator<<(poVar5,&str->_pos);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        std::endl<char,std::char_traits<char>>(poVar5);
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar6 = &PTR__E_0059bd80;
        std::__cxx11::stringbuf::str();
        __cxa_throw(puVar6,&E::typeinfo,E::~E);
      }
      pPVar7 = this->_m_po;
      __position._M_current =
           (pPVar7->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pPVar7->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        __args = &pPVar7->_m_lp_uint;
        goto LAB_0043585c;
      }
      local_1b0[0] = pPVar7->_m_lp_uint;
    }
    *__position._M_current = local_1b0[0];
    (pPVar7->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void ParserPOMDPFormat_Spirit::StoreLPToState::operator()(iterator_t str, iterator_t end) const
{
    if(DEBUG_POMDP_PARSE)
        cout << "StoreLPToState: pushing "<<string(str,end)<< " on __m_po->_m_lp_sI"<<endl;
    //we are parsing a new to state - the previous is not valid
    //any more, so we clear the state index vector
    _m_po->_m_lp_toSI.clear();
    if(_m_po->_m_lp_type == UINT)
    {
        unsigned int index = _m_po->_m_lp_uint;
        size_t nrS =  _m_po->GetPOMDPDiscrete()->GetNrStates();
        if(index >= nrS)
        {            
            stringstream ss; ss<<"StoreLPToState: '"<< index<< "' is not a valid state index!? Number of states is " << nrS <<" (at " <<str.get_position()<<")"<<endl; throw E(ss);
        }

        _m_po->_m_lp_toSI.push_back( _m_po->_m_lp_uint );
    }
    else if(_m_po->_m_lp_type == STRING)
    {
        try
        {
            Index sI = _m_po->GetPOMDPDiscrete()->GetStateIndexByName(
                _m_po->_m_lp_string);
            _m_po->_m_lp_toSI.push_back(sI);
        }
        catch(E e)
        {
            stringstream ermsg; ermsg << e.SoftPrint() << " (at " << 
                str.get_position() << ")"<<endl;
            throw E(ermsg);
        }
    }
    else if(_m_po->_m_lp_type == ASTERICK )
        _m_po->_m_lp_toSI.push_back(_m_po->_m_anyStateIndex);
    else
        throw E("StoreLPToState expected that the last parsed type is a state index(uint), state name (string) or wilcard ('*').");
}